

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&>,std::tuple<phmap::priv::Tracked<int>&>>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
           *this,size_t i,piecewise_construct_t *args,
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<phmap::priv::Tracked<int>_&> *args_2)

{
  long lVar1;
  value_type *pvVar2;
  
  lVar1 = *(long *)(this + 8);
  pvVar2 = NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>::
           new_element<std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&>,std::tuple<phmap::priv::Tracked<int>&>>
                     ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::Tracked<int>_>_>
                       *)(this + 0x28),args,args_1,args_2);
  *(value_type **)(lVar1 + i * 8) = pvVar2;
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);
        
#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
        // this check can be costly, so do it only when requested
        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
#endif
    }